

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_send_close(nni_ws *ws,uint16_t code)

{
  _Bool _Var1;
  nni_aio *aio_00;
  nni_aio *aio;
  int rv;
  uint8_t buf [2];
  ws_frame *frame;
  uint16_t code_local;
  nni_ws *ws_local;
  
  aio_00 = &ws->closeaio;
  aio._6_1_ = (undefined1)(code >> 8);
  aio._7_1_ = (undefined1)code;
  if (((ws->closed & 1U) == 0) && ((ws->ready & 1U) != 0)) {
    ws->closed = true;
    nni_aio_reset(aio_00);
    ws->wclose = true;
    aio._0_4_ = ws_msg_init_control((ws_frame **)&rv,ws,'\b',(uint8_t *)((long)&aio + 6),2);
    if ((nng_err)aio == NNG_OK) {
      _Var1 = nni_aio_start(aio_00,ws_cancel_close,ws);
      if (_Var1) {
        nni_list_prepend(&ws->txq,_rv);
        ws_start_write(ws);
      }
      else {
        ws->wclose = false;
        ws_frame_fini(_rv);
      }
    }
    else {
      ws->wclose = false;
      nni_aio_finish_error(aio_00,(nng_err)aio);
    }
  }
  return;
}

Assistant:

static void
ws_send_close(nni_ws *ws, uint16_t code)
{
	ws_frame *frame;
	uint8_t   buf[sizeof(uint16_t)];
	int       rv;
	nni_aio  *aio = &ws->closeaio;

	NNI_PUT16(buf, code);

	if (ws->closed || !ws->ready) {
		return;
	}
	ws->closed = true;

	nni_aio_reset(aio);
	ws->wclose = true;
	rv = ws_msg_init_control(&frame, ws, WS_CLOSE, buf, sizeof(buf));
	if (rv != 0) {
		ws->wclose = false;
		nni_aio_finish_error(aio, rv);
		return;
	}
	if (!nni_aio_start(aio, ws_cancel_close, ws)) {
		ws->wclose = false;
		ws_frame_fini(frame);
		return;
	}
	// This gets inserted at the head.
	nni_list_prepend(&ws->txq, frame);
	ws_start_write(ws);
}